

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Message * __thiscall google::protobuf::MapValueRef::GetMessageValue(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  LogFinisher local_55 [13];
  LogMessage local_48;
  MapValueRef *local_10;
  MapValueRef *this_local;
  
  local_10 = this;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x279);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::GetMessageValue");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pcVar3 = FieldDescriptor::CppTypeName(CPPTYPE_MESSAGE);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pcVar3 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    internal::LogFinisher::operator=(local_55,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (Message *)this->data_;
}

Assistant:

const Message& GetMessageValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_MESSAGE,
               "MapValueRef::GetMessageValue");
    return *reinterpret_cast<Message*>(data_);
  }